

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::BrLocalProperty
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,PropertyIdIndexType index)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_2e;
  PropertyIdIndexType local_2c;
  undefined8 uStack_28;
  OpLayoutBrLocalProperty data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  ByteCodeLabel local_18;
  PropertyIdIndexType index_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  offsetOfRelativeJumpOffsetFromEnd._4_4_ = index;
  local_18 = labelID;
  index_local._2_2_ = op;
  _labelID_local = this;
  CheckOpen(this);
  op_00 = index_local._2_2_;
  OpLayoutType::OpLayoutType((OpLayoutType *)&offsetOfRelativeJumpOffsetFromEnd,BrLocalProperty);
  CheckOp(this,op_00,offsetOfRelativeJumpOffsetFromEnd._0_4_);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(index_local._2_2_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x386,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  CheckLabel(this,local_18);
  uStack_28 = 6;
  local_2e = 6;
  local_2c = offsetOfRelativeJumpOffsetFromEnd._4_4_;
  Data::Encode(&this->m_byteCodeData,index_local._2_2_,&local_2e,6,this);
  AddJumpOffset(this,index_local._2_2_,local_18,6);
  return;
}

Assistant:

void ByteCodeWriter::BrLocalProperty(OpCode op, ByteCodeLabel labelID, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrLocalProperty);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrLocalProperty) - offsetof(OpLayoutBrLocalProperty, RelativeJumpOffset);
        OpLayoutBrLocalProperty data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.PropertyIdIndex = index;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }